

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void addfield(lua_State *L,luaL_Buffer *b,int i)

{
  int iVar1;
  char *pcVar2;
  
  lua_rawgeti(L,1,i);
  iVar1 = lua_isstring(L,-1);
  if (iVar1 != 0) {
    luaL_addvalue(b);
    return;
  }
  iVar1 = lua_type(L,-1);
  if (iVar1 == -1) {
    pcVar2 = "no value";
  }
  else {
    pcVar2 = luaT_typenames[iVar1];
  }
  luaL_error(L,"invalid value (%s) at index %d in table for \'concat\'",pcVar2,(ulong)(uint)i);
}

Assistant:

static void addfield(lua_State*L,luaL_Buffer*b,int i){
lua_rawgeti(L,1,i);
if(!lua_isstring(L,-1))
luaL_error(L,"invalid value (%s) at index %d in table for "
LUA_QL("concat"),luaL_typename(L,-1),i);
luaL_addvalue(b);
}